

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O3

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::addOffsetGlobal(Replacer *this,Expression *toExpr,Name memory)

{
  BinaryOp BVar1;
  pointer pNVar2;
  char *pcVar3;
  ulong uVar4;
  undefined8 uVar5;
  uint uVar6;
  mapped_type *pmVar7;
  Expression *pEVar8;
  undefined1 local_58 [8];
  Name memory_local;
  
  memory_local.super_IString.str._M_len = memory.super_IString.str._M_str;
  local_58 = memory.super_IString.str._M_len;
  pmVar7 = std::__detail::
           _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)&this->parent->memoryIdxMap,(key_type *)local_58);
  if (*pmVar7 != 0) {
    uVar6 = *pmVar7 - 1;
    pNVar2 = (this->parent->offsetGlobalNames).
             super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar3 = pNVar2[uVar6].super_IString.str._M_str;
    if (pcVar3 != (char *)0x0) {
      uVar4 = (this->parent->pointerType).id;
      memory_local.super_IString.str._M_str = (char *)toExpr;
      if (6 < uVar4) {
        __assert_fail("isBasic() && \"Basic type expected\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                      ,0xc6,"BasicType wasm::Type::getBasic() const");
      }
      uVar5 = pNVar2[uVar6].super_IString.str._M_len;
      BVar1 = *(BinaryOp *)(&DAT_00b76e60 + uVar4 * 4);
      pEVar8 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
      pEVar8->_id = GlobalGetId;
      *(undefined8 *)(pEVar8 + 1) = uVar5;
      pEVar8[1].type.id = (uintptr_t)pcVar3;
      (pEVar8->type).id = uVar4;
      toExpr = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
      (((Binary *)toExpr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id
           = BinaryId;
      (((Binary *)toExpr)->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type
      .id = 0;
      ((Binary *)toExpr)->op = BVar1;
      ((Binary *)toExpr)->left = pEVar8;
      ((Binary *)toExpr)->right = (Expression *)memory_local.super_IString.str._M_str;
      Binary::finalize((Binary *)toExpr);
    }
  }
  return (Expression *)(Binary *)toExpr;
}

Assistant:

Expression* addOffsetGlobal(Expression* toExpr, Name memory) {
      auto memoryIdx = parent.memoryIdxMap.at(memory);
      auto offsetGlobal = parent.getOffsetGlobal(memoryIdx);
      Expression* returnExpr;
      if (offsetGlobal) {
        returnExpr = builder.makeBinary(
          Abstract::getBinary(parent.pointerType, Abstract::Add),
          builder.makeGlobalGet(offsetGlobal, parent.pointerType),
          toExpr);
      } else {
        returnExpr = toExpr;
      }
      return returnExpr;
    }